

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::
       format_decimal<char,unsigned_int,char*,fmt::v5::internal::no_thousands_sep>
                 (undefined8 param_1,undefined4 param_2,undefined4 param_3)

{
  char *begin;
  type pcVar1;
  char *end;
  char_type buffer [13];
  char *in_stack_ffffffffffffffc8;
  undefined1 local_25 [13];
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_18 = param_3;
  local_14 = param_2;
  local_10 = param_1;
  begin = format_decimal<unsigned_int,char,fmt::v5::internal::no_thousands_sep>
                    (local_25,param_2,param_3);
  pcVar1 = copy_str<char,char*,char*>(begin,in_stack_ffffffffffffffc8,(char *)0x10fd9c);
  return pcVar1;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}